

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_mwhere(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  BUFFER *buffer;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  DESCRIPTOR_DATA *pDVar9;
  CHAR_DATA *pCVar10;
  uint uVar11;
  char buf [4608];
  undefined8 in_stack_ffffffffffffeda8;
  undefined4 uVar12;
  char local_1238 [4616];
  
  cVar1 = *argument;
  buffer = new_buf();
  if (cVar1 == '\0') {
    if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
      uVar11 = 0;
      pDVar9 = descriptor_list;
      do {
        pCVar10 = pDVar9->character;
        if ((((pCVar10 != (CHAR_DATA *)0x0) && (pDVar9->connected == 0)) &&
            (pCVar10->in_room != (ROOM_INDEX_DATA *)0x0)) && (bVar4 = can_see(ch,pCVar10), bVar4)) {
          bVar4 = can_see_room(ch,pDVar9->character->in_room);
          uVar12 = (undefined4)((ulong)in_stack_ffffffffffffeda8 >> 0x20);
          if (bVar4) {
            pCVar10 = pDVar9->character;
            uVar11 = uVar11 + 1;
            if (pDVar9->original == (CHAR_DATA *)0x0) {
              bVar4 = is_npc(pCVar10);
              pcVar7 = (&pCVar10->name)[!bVar4];
              pcVar5 = get_room_name(pCVar10->in_room);
              sprintf(local_1238,"%3d) %s is in %s [%d]\n\r",(ulong)uVar11,pcVar7,pcVar5,
                      (ulong)(uint)(int)pCVar10->in_room->vnum);
            }
            else {
              pcVar7 = pDVar9->original->true_name;
              pcVar5 = pCVar10->short_descr;
              pcVar6 = get_room_name(pCVar10->in_room);
              in_stack_ffffffffffffeda8 = CONCAT44(uVar12,(int)pCVar10->in_room->vnum);
              sprintf(local_1238,"%3d) %s (in the body of %s) is in %s [%d]\n\r",(ulong)uVar11,
                      pcVar7,pcVar5,pcVar6,in_stack_ffffffffffffeda8);
            }
            add_buf(buffer,local_1238);
          }
        }
        pDVar9 = pDVar9->next;
      } while (pDVar9 != (DESCRIPTOR_DATA *)0x0);
    }
LAB_0026b582:
    pcVar7 = buf_string(buffer);
    page_to_char(pcVar7,ch);
  }
  else {
    if (char_list != (CHAR_DATA *)0x0) {
      bVar4 = false;
      uVar11 = 0;
      pCVar10 = char_list;
      do {
        while (((pCVar10->in_room != (ROOM_INDEX_DATA *)0x0 && (bVar3 = can_see(ch,pCVar10), bVar3))
               && (bVar3 = is_name(argument,pCVar10->name), bVar3))) {
          bVar4 = is_npc(pCVar10);
          iVar8 = 0;
          if (bVar4) {
            iVar8 = (int)pCVar10->pIndexData->vnum;
          }
          uVar11 = uVar11 + 1;
          bVar4 = is_npc(pCVar10);
          pcVar7 = (&pCVar10->name)[(ulong)bVar4 * 4];
          sVar2 = pCVar10->in_room->vnum;
          pcVar5 = get_room_name(pCVar10->in_room);
          sprintf(local_1238,"%3d) [%5d] %-28s [%5d] %s\n\r",(ulong)uVar11,iVar8,pcVar7,
                  (ulong)(uint)(int)sVar2,pcVar5);
          add_buf(buffer,local_1238);
          pCVar10 = pCVar10->next;
          bVar4 = true;
          if (pCVar10 == (CHAR_DATA *)0x0) goto LAB_0026b582;
        }
        pCVar10 = pCVar10->next;
      } while (pCVar10 != (CHAR_DATA *)0x0);
      if (bVar4) goto LAB_0026b582;
    }
    act("You didn\'t find any $T.",ch,(void *)0x0,argument,3);
  }
  free_buf(buffer);
  return;
}

Assistant:

void do_mwhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	BUFFER *buffer;
	CHAR_DATA *victim;
	bool found;
	int count = 0;

	if (argument[0] == '\0')
	{
		DESCRIPTOR_DATA *d;

		/* show characters logged */

		buffer = new_buf();
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->character != nullptr
				&& d->connected == CON_PLAYING
				&& d->character->in_room != nullptr
				&& can_see(ch, d->character)
				&& can_see_room(ch, d->character->in_room))
			{
				victim = d->character;
				count++;

				if (d->original != nullptr)
				{
					sprintf(buf, "%3d) %s (in the body of %s) is in %s [%d]\n\r",
						count,
						d->original->true_name,
						victim->short_descr,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}
				else
				{
					sprintf(buf, "%3d) %s is in %s [%d]\n\r",
						count,
						is_npc(victim) ? victim->name : victim->true_name,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}

				add_buf(buffer, buf);
			}
		}

		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		return;
	}

	found = false;
	buffer = new_buf();

	for (victim = char_list; victim != nullptr; victim = victim->next)
	{
		if (victim->in_room != nullptr && can_see(ch, victim) && is_name(argument, victim->name))
		{
			found = true;
			count++;

			sprintf(buf, "%3d) [%5d] %-28s [%5d] %s\n\r",
				count,
				is_npc(victim) ? victim->pIndexData->vnum : 0,
				is_npc(victim) ? victim->short_descr : victim->name,
				victim->in_room->vnum,
				get_room_name(victim->in_room));
			add_buf(buffer, buf);
		}
	}

	if (!found)
		act("You didn't find any $T.", ch, nullptr, argument, TO_CHAR);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}